

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementHexaANCF_3843 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Scalar *pSVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Matrix<double,__1,__1,_1,__1,__1> *this_00;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3> SD_precompute_D;
  MatrixNx3c Sxi_D;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> local_730;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false,_true> local_6f8;
  Matrix<double,_3,_3,_1,_3,_3> local_6c8;
  Matrix<double,_32,_3,_1,_32,_3> local_680;
  MatrixNx3c local_380;
  undefined1 extraout_var [56];
  
  this_00 = &this->m_SD;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,0x20,0xc0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&(this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x40,1)
  ;
  lVar6 = *(long *)(DAT_011df560 + 0x48);
  lVar7 = *(long *)(DAT_011df560 + 0x50);
  lVar8 = DAT_011df560;
  for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < (ulong)(lVar7 - lVar6 >> 3); uVar10 = uVar10 + 1
      ) {
    for (uVar12 = 0; uVar13 = (ulong)uVar12, uVar13 < (ulong)(lVar7 - lVar6 >> 3);
        uVar12 = uVar12 + 1) {
      uVar5 = 0;
      while( true ) {
        uVar14 = (ulong)uVar5;
        lVar7 = *(long *)(lVar8 + 0x50);
        lVar6 = *(long *)(lVar8 + 0x48);
        uVar9 = lVar7 - lVar6 >> 3;
        if (uVar9 <= uVar14) break;
        lVar8 = (uVar9 * uVar11 + uVar13) * uVar9;
        lVar7 = *(long *)(static_tables_3843 + 0x48);
        dVar1 = *(double *)(lVar7 + uVar11 * 8);
        dVar2 = *(double *)(lVar7 + uVar13 * 8);
        dVar3 = *(double *)(lVar7 + uVar14 * 8);
        Calc_Sxi_D(this,&local_380,*(double *)(lVar6 + uVar11 * 8),*(double *)(lVar6 + uVar13 * 8),
                   *(double *)(lVar6 + uVar14 * 8));
        local_730.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_0>.
        m_data = (PointerType)&this->m_ebar0;
        local_730.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_0>.
        m_rows.m_value = (long)&local_380;
        local_6f8.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false>,_0>.m_data
             = (PointerType)&local_6c8;
        Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&local_6f8,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
                    *)&local_730);
        local_730.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_0>.
        m_data = (PointerType)&local_380;
        local_730.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>,_0>.
        m_rows.m_value = (long)&local_6c8;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,32,3,1,32,3>,Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
                  (&local_680,
                   (Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
                    *)&local_730);
        auVar16._0_8_ =
             Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                       (&local_6c8);
        auVar16._8_56_ = extraout_var;
        auVar15._8_8_ = 0x8000000000000000;
        auVar15._0_8_ = 0x8000000000000000;
        auVar15 = vxorpd_avx512vl(auVar16._0_16_,auVar15);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            &this->m_kGQ,lVar8 + uVar14);
        *pSVar4 = auVar15._0_8_ * dVar1 * dVar2 * dVar3;
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false,_true>
        ::BlockImpl_dense(&local_6f8,&local_680,0);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  (&local_730,this_00,lVar8 + uVar14);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,32,3,1,32,3>,32,1,false>>
                  (&local_730,
                   (Block<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false> *)&local_6f8);
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false,_true>
        ::BlockImpl_dense(&local_6f8,&local_680,1);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  (&local_730,this_00,lVar8 + 0x40 + uVar14);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,32,3,1,32,3>,32,1,false>>
                  (&local_730,
                   (Block<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false> *)&local_6f8);
        Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false,_true>
        ::BlockImpl_dense(&local_6f8,&local_680,2);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                  (&local_730,this_00,lVar8 + 0x80 + uVar14);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,32,3,1,32,3>,32,1,false>>
                  (&local_730,
                   (Block<Eigen::Matrix<double,_32,_3,_1,_32,_3>,_32,_1,_false> *)&local_6f8);
        uVar5 = uVar5 + 1;
        lVar8 = DAT_011df560;
      }
    }
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ.resize(NIP, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                auto index =
                    it_zeta + it_eta * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() +
                    it_xi * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() * GQTable->Lroots[GQ_idx_xi_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks across the entire element
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP) = SD_precompute_D.col(2);

                index++;
            }
        }
    }
}